

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Worker::Run(Worker *this)

{
  bool bVar1;
  handle_t pCVar2;
  char *pcVar3;
  long *plVar4;
  pointer ppVar5;
  pointer pRVar6;
  EasyHandle *pEVar7;
  LogManager *pLVar8;
  ostringstream *poVar9;
  ostream *poVar10;
  CurlException *this_00;
  int *piVar11;
  lock_guard<std::mutex> local_8e8;
  lock_t lock;
  int rval;
  int signalfd;
  timeval tv;
  string local_8c0 [32];
  CURLMcode local_8a0;
  int local_89c;
  CURLMcode mc;
  int maxfd;
  fd_set *__arr_2;
  __fd_mask *p_Stack_888;
  uint __i_2;
  fd_set *__arr_1;
  __fd_mask *p_Stack_878;
  uint __i_1;
  fd_set *__arr;
  rep rStack_868;
  uint __i;
  long local_860;
  long local_858;
  long sleep_duration;
  duration<long,_std::ratio<1L,_1000000000L>_> local_848;
  duration<long,_std::ratio<1L,_1000L>_> local_840;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> next_timeout;
  lock_guard<std::mutex> local_830;
  lock_t lock_1;
  Log local_820;
  _Base_ptr local_6a0;
  _Base_ptr local_698;
  exception *ex;
  Log local_4f8;
  _Self local_378;
  _Self local_370;
  iterator it;
  CURLMsg *m;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_358;
  int numLeft;
  byte local_339;
  Log local_338;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1b8;
  byte local_1a9;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_1a8;
  bool initial_ideling;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  timeout;
  undefined1 local_198 [7];
  bool do_dequeue;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int transfers_running;
  Worker *this_local;
  
  fdread.fds_bits[0xf]._4_4_ = -1;
  memset(fdwrite.fds_bits + 0xf,0,0x80);
  memset(fdexcep.fds_bits + 0xf,0,0x80);
  memset(local_198,0,0x80);
  timeout.__d.__r._7_1_ = 1;
  tStack_1a8 = GetNextTimeout(this);
  do {
    bVar1 = EvaluateState(this,fdread.fds_bits[0xf]._4_4_ != 0,(bool)(timeout.__d.__r._7_1_ & 1));
    if (!bVar1) {
LAB_0016dbe4:
      std::lock_guard<std::mutex>::lock_guard(&local_8e8,&this->mutex_);
      if (((this->close_pending_ & 1U) != 0) || ((this->abort_ & 1U) != 0)) {
        this->done_ = true;
      }
      std::lock_guard<std::mutex>::~lock_guard(&local_8e8);
      return;
    }
    if ((timeout.__d.__r._7_1_ & 1) != 0) {
      Dequeue(this);
      timeout.__d.__r._7_1_ = 0;
    }
    local_1a9 = fdread.fds_bits[0xf]._4_4_ == -1;
    curl_multi_perform(this->handle_,(undefined1 *)((long)fdread.fds_bits + 0x7c));
    if ((fdread.fds_bits[0xf]._4_4_ == 0) && ((local_1a9 & 1) != 0)) {
      fdread.fds_bits[0xf]._4_4_ = -1;
    }
    if (fdread.fds_bits[0xf]._4_4_ < 1) {
      local_1b8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      bVar1 = std::chrono::operator<(&stack0xfffffffffffffe58,&local_1b8);
      if (bVar1) {
        pLVar8 = logfault::LogManager::Instance();
        bVar1 = logfault::LogManager::IsRelevant(pLVar8,DEBUGGING);
        local_339 = 0;
        if (bVar1) {
          logfault::Log::Log(&local_338,DEBUGGING);
          local_339 = 1;
          poVar9 = logfault::Log::Line_abi_cxx11_(&local_338);
          poVar10 = std::operator<<((ostream *)poVar9,"restincurl: ");
          poVar10 = std::operator<<(poVar10,"Idle timeout. Will shut down the worker-thread.");
          std::ios::operator_cast_to_bool((ios *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18)));
        }
        if ((local_339 & 1) != 0) {
          logfault::Log::~Log(&local_338);
        }
        goto LAB_0016dbe4;
      }
    }
    else {
      tStack_358 = GetNextTimeout(this);
      tStack_1a8 = tStack_358;
    }
    m._4_4_ = 0;
    while (it._M_node = (_Base_ptr)curl_multi_info_read(this->handle_,(long)&m + 4),
          it._M_node != (_Base_ptr)0x0) {
      if (it._M_node == (_Base_ptr)0x0) {
        __assert_fail("m",
                      "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                      ,0x3d9,"void restincurl::Worker::Run()");
      }
      local_370._M_node =
           (_Base_ptr)
           std::
           map<void_*,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>_>
           ::find(&this->ongoing_,&(it._M_node)->_M_parent);
      local_378._M_node =
           (_Base_ptr)
           std::
           map<void_*,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>_>
           ::end(&this->ongoing_);
      bVar1 = std::operator!=(&local_370,&local_378);
      if (!bVar1) {
        pLVar8 = logfault::LogManager::Instance();
        bVar1 = logfault::LogManager::IsRelevant(pLVar8,DEBUGGING);
        lock_1._M_device._7_1_ = 0;
        if (bVar1) {
          logfault::Log::Log(&local_820,DEBUGGING);
          lock_1._M_device._7_1_ = 1;
          poVar9 = logfault::Log::Line_abi_cxx11_(&local_820);
          poVar10 = std::operator<<((ostream *)poVar9,"restincurl: ");
          poVar10 = std::operator<<(poVar10,"Failed to find easy_handle in ongoing!");
          std::ios::operator_cast_to_bool((ios *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18)));
        }
        if ((lock_1._M_device._7_1_ & 1) != 0) {
          logfault::Log::~Log(&local_820);
        }
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                      ,0x3ed,"void restincurl::Worker::Run()");
      }
      pLVar8 = logfault::LogManager::Instance();
      bVar1 = logfault::LogManager::IsRelevant(pLVar8,DEBUGGING);
      ex._7_1_ = 0;
      if (bVar1) {
        logfault::Log::Log(&local_4f8,DEBUGGING);
        ex._7_1_ = 1;
        poVar9 = logfault::Log::Line_abi_cxx11_(&local_4f8);
        poVar10 = std::operator<<((ostream *)poVar9,"restincurl: ");
        poVar10 = std::operator<<(poVar10,"Finishing request with easy-handle: ");
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                 ::operator->(&local_370);
        pRVar6 = std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::
                 operator->(&ppVar5->second);
        pEVar7 = Request::GetEasyHandle(pRVar6);
        pCVar2 = EasyHandle::operator_cast_to_void_(pEVar7);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,pCVar2);
        poVar10 = std::operator<<(poVar10,"; with result: ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,*(int *)&(it._M_node)->_M_left);
        poVar10 = std::operator<<(poVar10," expl: \'");
        pcVar3 = (char *)curl_easy_strerror(*(undefined4 *)&(it._M_node)->_M_left);
        poVar10 = std::operator<<(poVar10,pcVar3);
        poVar10 = std::operator<<(poVar10,"\'; with msg: ");
        plVar4 = (long *)std::ostream::operator<<(poVar10,(it._M_node)->_M_color);
        std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
      }
      if ((ex._7_1_ & 1) != 0) {
        logfault::Log::~Log(&local_4f8);
      }
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
               ::operator->(&local_370);
      pRVar6 = std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::
               operator->(&ppVar5->second);
      Request::Complete(pRVar6,*(CURLcode *)&(it._M_node)->_M_left,&(it._M_node)->_M_color);
      if ((it._M_node)->_M_color == _S_black) {
        curl_multi_remove_handle(this->handle_,(it._M_node)->_M_parent);
      }
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
               ::operator->(&local_370);
      pRVar6 = std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::
               operator->(&ppVar5->second);
      pEVar7 = Request::GetEasyHandle(pRVar6);
      EasyHandle::Close(pEVar7);
      local_698 = local_370._M_node;
      local_6a0 = (_Base_ptr)
                  std::
                  map<void*,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>,std::less<void*>,std::allocator<std::pair<void*const,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>>>
                  ::erase_abi_cxx11_((map<void*,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>,std::less<void*>,std::allocator<std::pair<void*const,std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>>>
                                      *)&this->ongoing_,local_370._M_node);
    }
    std::lock_guard<std::mutex>::lock_guard(&local_830,&this->mutex_);
    if (((this->abort_ & 1U) == 0) &&
       ((fdread.fds_bits[0xf]._4_4_ != 0 || ((this->close_pending_ & 1U) == 0)))) {
      next_timeout.__r._4_4_ = 0;
    }
    else {
      next_timeout.__r._4_4_ = 3;
    }
    std::lock_guard<std::mutex>::~lock_guard(&local_830);
    if (next_timeout.__r._4_4_ != 0) goto LAB_0016dbe4;
    sleep_duration = std::chrono::_V2::steady_clock::now();
    local_848.__r =
         (rep)std::chrono::operator-
                        (&stack0xfffffffffffffe58,
                         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&sleep_duration);
    local_840.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                        (&local_848);
    local_860 = 1;
    rStack_868 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_840);
    plVar4 = std::max<long>(&local_860,&stack0xfffffffffffff798);
    local_858 = *plVar4;
    p_Stack_878 = fdwrite.fds_bits + 0xf;
    for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
      p_Stack_878[__arr._4_4_] = 0;
    }
    p_Stack_888 = fdexcep.fds_bits + 0xf;
    for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
      p_Stack_888[__arr_1._4_4_] = 0;
    }
    _mc = local_198;
    for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
      *(undefined8 *)(_mc + (ulong)__arr_2._4_4_ * 8) = 0;
    }
    local_89c = -1;
    if (0 < fdread.fds_bits[0xf]._4_4_) {
      curl_multi_timeout(this->handle_,&local_858);
      if (local_858 < 0) {
        local_858 = 1000;
      }
      local_8a0 = curl_multi_fdset(this->handle_,fdwrite.fds_bits + 0xf,fdexcep.fds_bits + 0xf,
                                   local_198,&local_89c);
      if (local_8a0 != CURLM_OK) {
        tv.tv_usec._6_1_ = 1;
        this_00 = (CurlException *)__cxa_allocate_exception(0x18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_8c0,"curl_multi_fdset",(allocator *)((long)&tv.tv_usec + 7));
        CurlException::CurlException(this_00,(string *)local_8c0,local_8a0);
        tv.tv_usec._6_1_ = 0;
        __cxa_throw(this_00,&CurlException::typeinfo,CurlException::~CurlException);
      }
      if (local_89c == -1) {
        local_858 = 0x32;
      }
      local_8a0 = 0;
    }
    memset(&rval,0,0x10);
    _rval = local_858 / 1000;
    tv.tv_sec = (local_858 % 1000) * 1000;
    lock._M_device._4_4_ = Signaler::GetReadFd(&this->signal_);
    fdwrite.fds_bits[(long)(lock._M_device._4_4_ / 0x40) + 0xf] =
         1L << ((byte)((long)lock._M_device._4_4_ % 0x40) & 0x3f) |
         fdwrite.fds_bits[(long)(lock._M_device._4_4_ / 0x40) + 0xf];
    piVar11 = std::max<int>((int *)((long)&lock._M_device + 4),&local_89c);
    local_89c = *piVar11 + 1;
    lock._M_device._0_4_ =
         select(local_89c,(fd_set *)(fdwrite.fds_bits + 0xf),(fd_set *)(fdexcep.fds_bits + 0xf),
                (fd_set *)local_198,(timeval *)&rval);
    if ((0 < (int)lock._M_device) &&
       ((fdwrite.fds_bits[(long)(lock._M_device._4_4_ / 0x40) + 0xf] &
        1L << ((byte)((long)lock._M_device._4_4_ % 0x40) & 0x3f)) != 0)) {
      timeout.__d.__r._7_1_ = Signaler::WasSignalled(&this->signal_);
    }
    if ((this->pending_entries_in_queue_ & 1U) != 0) {
      timeout.__d.__r._7_1_ = 1;
    }
  } while( true );
}

Assistant:

void Run() {
            int transfers_running = -1;
            fd_set fdread = {};
            fd_set fdwrite = {};
            fd_set fdexcep = {};
            bool do_dequeue = true;
            auto timeout = GetNextTimeout();

            while (EvaluateState(transfers_running, do_dequeue)) {

                if (do_dequeue) {
                    Dequeue();
                    do_dequeue = false;
                }

                /* timeout or readable/writable sockets */
                const bool initial_ideling = transfers_running == -1;
                curl_multi_perform(handle_, &transfers_running);
                if ((transfers_running == 0) && initial_ideling) {
                    transfers_running = -1; // Let's ignore close_pending_ until we have seen a request
                }

                // Shut down the thread if we have been idling too long
                if (transfers_running <= 0) {
                    if (timeout < std::chrono::steady_clock::now()) {
                        RESTINCURL_LOG("Idle timeout. Will shut down the worker-thread.");
                        break;
                    }
                } else {
                    timeout = GetNextTimeout();
                }

                int numLeft = {};
                while (auto m = curl_multi_info_read(handle_, &numLeft)) {
                    assert(m);
                    auto it = ongoing_.find(m->easy_handle);
                    if (it != ongoing_.end()) {
                        RESTINCURL_LOG("Finishing request with easy-handle: "
                            << (EasyHandle::handle_t)it->second->GetEasyHandle()
                            << "; with result: " << m->data.result << " expl: '" << curl_easy_strerror(m->data.result)
                            << "'; with msg: " << m->msg);

                        try {
                            it->second->Complete(m->data.result, m->msg);
                        } catch(const std::exception& ex) {
                            RESTINCURL_LOG("Complete threw: " << ex.what());
                        }
                        if (m->msg == CURLMSG_DONE) {
                            curl_multi_remove_handle(handle_, m->easy_handle);
                        }
                        it->second->GetEasyHandle().Close();
                        ongoing_.erase(it);
                    } else {
                        RESTINCURL_LOG("Failed to find easy_handle in ongoing!");
                        assert(false);
                    }
                }

                {
                    lock_t lock(mutex_);
                    // Avoid using select() as a timer when we need to exit anyway
                    if (abort_ || (!transfers_running && close_pending_)) {
                        break;
                    }
                }

                auto next_timeout = std::chrono::duration_cast<std::chrono::milliseconds>(
                    timeout - std::chrono::steady_clock::now());
                long sleep_duration = std::max<long>(1, next_timeout.count());
                /* extract sleep_duration value */


                FD_ZERO(&fdread);
                FD_ZERO(&fdwrite);
                FD_ZERO(&fdexcep);

                int maxfd = -1;
                if (transfers_running > 0) {
                    curl_multi_timeout(handle_, &sleep_duration);
                    if (sleep_duration < 0) {
                        sleep_duration = 1000;
                    }

                    /* get file descriptors from the transfers */
                    const auto mc = curl_multi_fdset(handle_, &fdread, &fdwrite, &fdexcep, &maxfd);
                    RESTINCURL_LOG_TRACE("maxfd: " << maxfd);
                    if (mc != CURLM_OK) {
                        throw CurlException("curl_multi_fdset", mc);
                    }

                    if (maxfd == -1) {
                        // Curl want's us to revisit soon
                        sleep_duration = 50;
                    }
                } // active transfers

                struct timeval tv = {};
                tv.tv_sec = sleep_duration / 1000;
                tv.tv_usec = (sleep_duration % 1000) * 1000;

                const auto signalfd = signal_.GetReadFd();

                RESTINCURL_LOG_TRACE("Calling select() with timeout of "
                    << sleep_duration
                    << " ms. Next timeout in " << next_timeout.count() << " ms. "
                    << transfers_running << " active transfers.");

                FD_SET(signalfd, &fdread);
                maxfd = std::max(signalfd,  maxfd) + 1;

                const auto rval = select(maxfd, &fdread, &fdwrite, &fdexcep, &tv);
                RESTINCURL_LOG_TRACE("select(" << maxfd << ") returned: " << rval);

                if (rval > 0) {
                    if (FD_ISSET(signalfd, &fdread)) {
                        RESTINCURL_LOG_TRACE("FD_ISSET was true: ");
                        do_dequeue = signal_.WasSignalled();
                    }

                }
                if (pending_entries_in_queue_) {
                    do_dequeue = true;
                }
            } // loop


            lock_t lock(mutex_);
            if (close_pending_ || abort_) {
                done_ = true;
            }
        }